

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadSections(BinaryReader *this,ReadSectionsOptions *options)

{
  bool bVar1;
  BinarySection sec;
  BinarySectionOrder BVar2;
  BinarySectionOrder BVar3;
  Result RVar4;
  char *pcVar5;
  Result local_e8;
  Enum local_e4;
  Enum local_e0;
  Enum local_dc;
  Enum local_d8;
  Enum local_d4;
  Enum local_d0;
  Enum local_cc;
  Enum local_c8;
  Enum local_c4;
  Enum local_c0;
  Enum local_bc;
  Enum local_b8;
  Enum local_b4;
  Enum local_b0;
  Enum local_ac;
  Enum local_a8;
  Enum local_a4;
  Enum local_a0;
  Enum local_9c;
  Enum local_98;
  Enum local_94;
  Enum local_90;
  Enum local_8c;
  Enum local_88;
  Enum local_84;
  Enum local_80;
  Enum local_7c;
  Enum local_78;
  Enum local_74;
  Result local_70;
  byte local_69;
  Result section_result;
  bool stop_on_first_error;
  Result local_60;
  BinarySection section;
  undefined1 local_58 [8];
  ReadEndRestoreGuard guard;
  Offset local_40;
  Offset section_size;
  uint8_t section_code;
  bool seen_section_code [14];
  Index section_index;
  Result result;
  ReadSectionsOptions *options_local;
  BinaryReader *this_local;
  
  Result::Result((Result *)(seen_section_code + 10),Ok);
  seen_section_code[6] = false;
  seen_section_code[7] = false;
  seen_section_code[8] = false;
  seen_section_code[9] = false;
  memset((void *)((long)&section_size + 2),0,0xe);
  do {
    if ((this->state_).size <= (this->state_).offset) {
      RVar4.enum_._0_1_ = seen_section_code[10];
      RVar4.enum_._1_1_ = seen_section_code[0xb];
      RVar4.enum_._2_1_ = seen_section_code[0xc];
      RVar4.enum_._3_1_ = seen_section_code[0xd];
      return (Result)RVar4.enum_;
    }
    guard.previous_value_._4_4_ = ReadU8(this,(uint8_t *)((long)&section_size + 1),"section code");
    bVar1 = Failed(guard.previous_value_._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    guard.previous_value_._0_4_ = ReadOffset(this,&local_40,"section size");
    bVar1 = Failed(guard.previous_value_._0_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
    ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                       *)local_58,this);
    this->read_end_ = (this->state_).offset + local_40;
    if (section_size._1_1_ < 0xe) {
      sec = (BinarySection)section_size._1_1_;
      if (sec != Custom) {
        if ((*(byte *)((long)&section_size + (ulong)section_size._1_1_ + 2) & 1) != 0) {
          pcVar5 = GetSectionName(sec);
          PrintError(this,"multiple %s sections",pcVar5);
          Result::Result((Result *)((long)&this_local + 4),Error);
          section = Type;
          goto LAB_00130c6c;
        }
        *(undefined1 *)((long)&section_size + (ulong)section_size._1_1_ + 2) = 1;
      }
      if ((this->state_).size < this->read_end_) {
        PrintError(this,"invalid section size: extends past end");
        Result::Result((Result *)((long)&this_local + 4),Error);
        section = Type;
      }
      else {
        if ((this->last_known_section_ != Invalid) && (sec != Custom)) {
          BVar2 = GetSectionOrder(sec);
          BVar3 = GetSectionOrder(this->last_known_section_);
          if ((int)BVar2 <= (int)BVar3) {
            pcVar5 = GetSectionName(sec);
            PrintError(this,"section %s out of order",pcVar5);
            Result::Result((Result *)((long)&this_local + 4),Error);
            section = Type;
            goto LAB_00130c6c;
          }
        }
        if (((this->did_read_names_section_ & 1U) == 0) || (sec == Custom)) {
          section_result.enum_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                         (this->delegate_,(ulong)(uint)seen_section_code._6_4_,(ulong)(uint)sec,
                          local_40);
          bVar1 = Succeeded(section_result);
          if (bVar1) {
            local_69 = this->options_->stop_on_first_error & 1;
            Result::Result(&local_70,Error);
            switch(sec) {
            case Custom:
              local_74 = (Enum)ReadCustomSection(this,seen_section_code._6_4_,local_40);
              local_70 = (Result)local_74;
              if ((this->options_->fail_on_custom_section_error & 1U) == 0) {
                local_69 = 0;
              }
              else {
                local_78 = local_74;
                Result::operator|=((Result *)(seen_section_code + 10),(Result)local_74);
              }
              break;
            case Type:
              local_80 = (Enum)ReadTypeSection(this,local_40);
              local_7c = local_80;
              local_70 = (Result)local_80;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_80);
              break;
            case Import:
              local_88 = (Enum)ReadImportSection(this,local_40);
              local_84 = local_88;
              local_70 = (Result)local_88;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_88);
              break;
            case Function:
              local_90 = (Enum)ReadFunctionSection(this,local_40);
              local_8c = local_90;
              local_70 = (Result)local_90;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_90);
              break;
            case Table:
              local_98 = (Enum)ReadTableSection(this,local_40);
              local_94 = local_98;
              local_70 = (Result)local_98;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_98);
              break;
            case Memory:
              local_a0 = (Enum)ReadMemorySection(this,local_40);
              local_9c = local_a0;
              local_70 = (Result)local_a0;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_a0);
              break;
            case Global:
              local_a8 = (Enum)ReadGlobalSection(this,local_40);
              local_a4 = local_a8;
              local_70 = (Result)local_a8;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_a8);
              break;
            case Export:
              local_b0 = (Enum)ReadExportSection(this,local_40);
              local_ac = local_b0;
              local_70 = (Result)local_b0;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_b0);
              break;
            case Start:
              local_b8 = (Enum)ReadStartSection(this,local_40);
              local_b4 = local_b8;
              local_70 = (Result)local_b8;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_b8);
              break;
            case Elem:
              local_c0 = (Enum)ReadElemSection(this,local_40);
              local_bc = local_c0;
              local_70 = (Result)local_c0;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_c0);
              break;
            case Code:
              local_c8 = (Enum)ReadCodeSection(this,local_40);
              local_c4 = local_c8;
              local_70 = (Result)local_c8;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_c8);
              break;
            case Data:
              local_d0 = (Enum)ReadDataSection(this,local_40);
              local_cc = local_d0;
              local_70 = (Result)local_d0;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_d0);
              break;
            case DataCount:
              bVar1 = Features::bulk_memory_enabled(&this->options_->features);
              if (!bVar1) {
                PrintError(this,"invalid section code: %u",(ulong)(uint)sec);
                Result::Result((Result *)((long)&this_local + 4),Error);
                section = Type;
                goto LAB_00130c6c;
              }
              local_e0 = (Enum)ReadDataCountSection(this,local_40);
              local_dc = local_e0;
              local_70 = (Result)local_e0;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_e0);
              break;
            case Last:
              bVar1 = Features::exceptions_enabled(&this->options_->features);
              if (!bVar1) {
                PrintError(this,"invalid section code: %u",(ulong)(uint)sec);
                Result::Result((Result *)((long)&this_local + 4),Error);
                section = Type;
                goto LAB_00130c6c;
              }
              local_d8 = (Enum)ReadTagSection(this,local_40);
              local_d4 = local_d8;
              local_70 = (Result)local_d8;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_d8);
              break;
            case Invalid:
              abort();
            }
            local_e4 = local_70.enum_;
            bVar1 = Succeeded(local_70);
            if ((bVar1) && ((this->state_).offset != this->read_end_)) {
              PrintError(this,"unfinished section (expected end: 0x%zx)",this->read_end_);
              Result::Result(&local_e8,Error);
              local_70.enum_ = local_e8.enum_;
              Result::operator|=((Result *)(seen_section_code + 10),local_e8);
            }
            bVar1 = Failed(local_70);
            if (bVar1) {
              if ((local_69 & 1) != 0) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                section = Type;
                goto LAB_00130c6c;
              }
              (this->state_).offset = this->read_end_;
            }
            if (sec != Custom) {
              this->last_known_section_ = sec;
            }
            section = Custom;
          }
          else {
            PrintError(this,"BeginSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            section = Type;
          }
        }
        else {
          pcVar5 = GetSectionName(sec);
          PrintError(this,"%s section can not occur after Name section",pcVar5);
          Result::Result((Result *)((long)&this_local + 4),Error);
          section = Type;
        }
      }
    }
    else {
      PrintError(this,"invalid section code: %u",(ulong)section_size._1_1_);
      if ((options->stop_on_first_error & 1U) == 0) {
        Result::Result(&local_60,Error);
        seen_section_code[10] = (bool)(undefined1)local_60.enum_;
        seen_section_code[0xb] = (bool)local_60.enum_._1_1_;
        seen_section_code[0xc] = (bool)local_60.enum_._2_1_;
        seen_section_code[0xd] = (bool)local_60.enum_._3_1_;
        (this->state_).offset = this->read_end_;
        section = Table;
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Error);
        section = Type;
      }
    }
LAB_00130c6c:
    ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
    ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                        *)local_58);
    if ((section != Custom) && (section == Type)) {
      return (Result)this_local._4_4_;
    }
    seen_section_code._6_4_ = seen_section_code._6_4_ + 1;
  } while( true );
}

Assistant:

Result BinaryReader::ReadSections(const ReadSectionsOptions& options) {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint8_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU8(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      if (options.stop_on_first_error) {
        return Result::Error;
      }
      // If we don't have to stop on first error, continue reading
      // sections, because although we could not understand the
      // current section, we can continue and correctly parse
      // subsequent sections, so we can give back as much information
      // as we can understand.
      result = Result::Error;
      state_.offset = read_end_;
      continue;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_index, section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Tag:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadTagSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}